

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_extension.c
# Opt level: O1

void prf_push_extension_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_push_extension_info.opcode) {
    state->extension_level = state->extension_level + 1;
    return;
  }
  prf_error(9,"tried push extension entry state method on node of type %d.");
  return;
}

Assistant:

static
void
prf_push_extension_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );
    if ( node->opcode != prf_push_extension_info.opcode ) {
        prf_error( 9,
            "tried push extension entry state method on node of type %d.",
            node->opcode );
        return;
    }
    state->extension_level++;
}